

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

char * Acb_Oper2Name(int i)

{
  char *pcStack_10;
  int i_local;
  
  if (i == 7) {
    pcStack_10 = "const0";
  }
  else if (i == 8) {
    pcStack_10 = "const1";
  }
  else if (i == 9) {
    pcStack_10 = "constX";
  }
  else if (i == 0xb) {
    pcStack_10 = "buf";
  }
  else if (i == 0xc) {
    pcStack_10 = "not";
  }
  else if (i == 0xd) {
    pcStack_10 = "and";
  }
  else if (i == 0xe) {
    pcStack_10 = "nand";
  }
  else if (i == 0xf) {
    pcStack_10 = "or";
  }
  else if (i == 0x10) {
    pcStack_10 = "nor";
  }
  else if (i == 0x11) {
    pcStack_10 = "xor";
  }
  else if (i == 0x12) {
    pcStack_10 = "xnor";
  }
  else if (i == 0x15) {
    pcStack_10 = "mux";
  }
  else {
    if (i != 0x4e) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0x6d,"char *Acb_Oper2Name(int)");
    }
    pcStack_10 = "_DC";
  }
  return pcStack_10;
}

Assistant:

static inline char * Acb_Oper2Name( int i )
{
    if ( i == ABC_OPER_CONST_F  )  return "const0";
    if ( i == ABC_OPER_CONST_T  )  return "const1";
    if ( i == ABC_OPER_CONST_X  )  return "constX";
    if ( i == ABC_OPER_BIT_BUF  )  return "buf";
    if ( i == ABC_OPER_BIT_INV  )  return "not";
    if ( i == ABC_OPER_BIT_AND  )  return "and";
    if ( i == ABC_OPER_BIT_NAND )  return "nand";
    if ( i == ABC_OPER_BIT_OR   )  return "or";
    if ( i == ABC_OPER_BIT_NOR  )  return "nor";
    if ( i == ABC_OPER_BIT_XOR  )  return "xor";
    if ( i == ABC_OPER_BIT_NXOR )  return "xnor";
    if ( i == ABC_OPER_BIT_MUX )   return "mux";
    if ( i == ABC_OPER_TRI )       return "_DC";
    assert( 0 );
    return NULL;
}